

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

long FMget_array_element_count(FMFormat_conflict f,FMVarInfoList var,char *data,int encode)

{
  int iVar1;
  size_t sVar2;
  int i;
  long lVar3;
  long lVar4;
  _FMgetFieldStruct local_48;
  
  lVar4 = 1;
  for (lVar3 = 0; lVar3 < var->dimen_count; lVar3 = lVar3 + 1) {
    sVar2 = (size_t)var->dimens[lVar3].static_size;
    if (sVar2 == 0) {
      iVar1 = var->dimens[lVar3].control_field_index;
      local_48.offset = (size_t)f->field_list[iVar1].field_offset;
      local_48.data_type = integer_type;
      local_48.size = f->field_list[iVar1].field_size;
      iVar1 = encode;
      if (encode != 0) {
        iVar1 = f->byte_reversal;
      }
      local_48._17_7_ = 0;
      local_48.byte_swap = (byte)iVar1;
      sVar2 = get_FMlong(&local_48,data);
    }
    lVar4 = lVar4 * sVar2;
  }
  return lVar4;
}

Assistant:

extern long
FMget_array_element_count(FMFormat f, FMVarInfoList var, char *data, int encode)
{
    int i;
    size_t count = 1;
    size_t tmp;
    for (i = 0; i < var->dimen_count; i++) {
	if (var->dimens[i].static_size != 0) {
	    count = count * var->dimens[i].static_size;
	} else {
	    int field = var->dimens[i].control_field_index;
	    struct _FMgetFieldStruct tmp_src_spec;
	    memset(&tmp_src_spec, 0, sizeof(tmp_src_spec));
	    tmp_src_spec.size = f->field_list[field].field_size;
	    tmp_src_spec.offset = f->field_list[field].field_offset;
	    tmp_src_spec.data_type = integer_type;
	    tmp_src_spec.byte_swap = f->byte_reversal;
	    if (!encode) {
		tmp_src_spec.byte_swap = 0;
		tmp_src_spec.src_float_format = tmp_src_spec.target_float_format;
	    }
	    tmp = get_FMlong(&tmp_src_spec, data);
	    count = count * tmp;
	}
    }
    return (long) count;
}